

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void loadCubemap(char *filename)

{
  stbi_uc *retval_from_stbi_load;
  size_t sVar1;
  ostream *poVar2;
  long *plVar3;
  undefined8 uVar4;
  char *__s;
  int c;
  int iVar5;
  long lVar6;
  int iVar7;
  int bpp;
  char local_39;
  int height;
  int width;
  
  retval_from_stbi_load = stbi_load(filename,&width,&height,&bpp,0);
  if (retval_from_stbi_load == (stbi_uc *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to load image ",0x15);
    if (filename == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x18b430);
    }
    else {
      sVar1 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,filename,sVar1);
    }
    plVar3 = &std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
    __s = stbi_failure_reason();
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x18b430);
    }
    else {
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
    lVar6 = std::cout;
LAB_0010fb68:
    std::ios::widen((char)*(undefined8 *)(lVar6 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loaded ",7);
    if (filename == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x18b430);
    }
    else {
      sVar1 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,filename,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,height);
    local_39 = 'x';
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_39,1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,width);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", comp = ",9);
    plVar3 = (long *)std::ostream::operator<<(poVar2,bpp);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    iVar5 = 0;
    lVar6 = 0;
    do {
      lVar6 = (long)(int)lVar6;
      iVar7 = 4;
      do {
        printf("%02d %02d %02d %02d  ",(ulong)retval_from_stbi_load[lVar6],
               (ulong)retval_from_stbi_load[lVar6 + 1],(ulong)retval_from_stbi_load[lVar6 + 2],
               (ulong)retval_from_stbi_load[lVar6 + 2]);
        lVar6 = lVar6 + 4;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      iVar5 = iVar5 + 1;
    } while (iVar5 != 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"...",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    if (bpp == 3) {
      uVar4 = 0x1907;
    }
    else {
      if (bpp != 4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Unsupported format: ",0x14);
        plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,bpp);
        lVar6 = *plVar3;
        goto LAB_0010fb68;
      }
      uVar4 = 0x1908;
    }
    glTexImage2D(0xde1,0,0x1907,width,height,0,uVar4,0x1401,retval_from_stbi_load);
    (*__glewGenerateMipmap)(0xde1);
    stbi_image_free(retval_from_stbi_load);
  }
  return;
}

Assistant:

void loadCubemap(const char *filename) {
    int width, height, bpp;
    unsigned char *pixels = stbi_load(filename, &width, &height, &bpp, STBI_default);
    if (pixels == nullptr) {
        cout << "Failed to load image " << filename << " (" << stbi_failure_reason() << ")" << endl;
        return;
    }
    cout << "Loaded " << filename << ", " << height << 'x' << width << ", comp = " << bpp << endl;
    int idx = 0;
    for (int c = 0; c < 8; c++) {
        for (int d = 0; d < 4; d++) {
            printf("%02d %02d %02d %02d  ", pixels[idx], pixels[idx+1], pixels[idx+2], pixels[idx+2]);
            idx += 4;
        }
        cout << endl;
    }
    cout << "..." << endl;

    GLenum format;
    switch(bpp) {
    case STBI_rgb:
        format = GL_RGB;
        break;
    case STBI_rgb_alpha:
        format = GL_RGBA;
        break;
    default:
        cout << "Unsupported format: " << bpp << endl;
        return;
    }

    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, width, height, 0, format, GL_UNSIGNED_BYTE, pixels);
    glGenerateMipmap(GL_TEXTURE_2D);

    stbi_image_free(pixels);
}